

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O3

void testJacobiEigenSolver<Imath_2_5::Matrix33<double>>(Matrix33<double> *A)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  size_t i;
  long lVar15;
  double *pdVar16;
  size_t i_1;
  double (*padVar17) [3];
  size_t j;
  long lVar18;
  size_t j_1;
  double *pdVar19;
  int j_3;
  int k;
  long lVar20;
  double *pdVar21;
  int k_1;
  double dVar22;
  double dVar23;
  Matrix33<double> MS;
  Matrix33<double> tmp;
  Matrix33<double> MA;
  TV S;
  Matrix33<double> V;
  Matrix33<double> AA;
  double local_1f0 [19];
  double local_158 [10];
  Vec3<double> local_108;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double dStack_98;
  double local_90;
  double dStack_88;
  double local_80;
  double dStack_78;
  double local_70;
  double local_68;
  double local_60 [9];
  
  dVar23 = 0.0;
  lVar15 = 0;
  padVar17 = (double (*) [3])A;
  do {
    lVar18 = 0;
    dVar22 = dVar23;
    do {
      dVar23 = ABS((*(double (*) [3])*padVar17)[lVar18]);
      if (dVar23 <= dVar22) {
        dVar23 = dVar22;
      }
      lVar18 = lVar18 + 1;
      dVar22 = dVar23;
    } while (lVar18 != 3);
    lVar15 = lVar15 + 1;
    padVar17 = padVar17 + 1;
  } while (lVar15 != 3);
  dVar22 = 2.220446049250313e-16;
  if (2.220446049250313e-16 <= dVar23) {
    dVar22 = dVar23;
  }
  dVar23 = dVar22 * 100.0 * 2.220446049250313e-16;
  pdVar16 = (double *)A;
  pdVar19 = local_60;
  for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
    *pdVar19 = *pdVar16;
    pdVar16 = pdVar16 + 1;
    pdVar19 = pdVar19 + 1;
  }
  padVar17 = (double (*) [3])&local_a8;
  local_90 = 0.0;
  local_80 = 0.0;
  dStack_78 = 0.0;
  local_a0 = 0.0;
  dStack_98 = 0.0;
  local_70 = 0.0;
  local_a8 = 1.0;
  dStack_88 = 1.0;
  local_68 = 1.0;
  Imath_2_5::jacobiEigenSolver<double>
            ((Matrix33<double> *)local_60,&local_108,(Matrix33<double> *)padVar17,
             2.220446049250313e-16);
  verifyOrthonormal<Imath_2_5::Matrix33<double>>((Matrix33<double> *)padVar17,dVar23);
  dVar14 = local_68;
  dVar13 = local_70;
  dVar12 = dStack_78;
  dVar11 = local_80;
  dVar10 = dStack_88;
  dVar9 = local_90;
  dVar8 = dStack_98;
  dVar7 = local_a0;
  dVar22 = local_a8;
  if (dVar23 <= ABS((local_90 * local_70 - dStack_78 * dStack_88) * dStack_98 +
                    (dStack_88 * local_68 - local_70 * local_80) * local_a8 +
                    (local_80 * dStack_78 - local_68 * local_90) * local_a0) + -1.0) {
    __assert_fail("abs(V.determinant()) - 1 < threshold",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                  ,0x8a,"void testJacobiEigenSolver(const TM &) [TM = Imath_2_5::Matrix33<double>]")
    ;
  }
  pdVar16 = local_1f0;
  local_1f0[3] = 0.0;
  local_1f0[5] = 0.0;
  local_1f0[6] = 0.0;
  local_1f0[1] = 0.0;
  local_1f0[2] = 0.0;
  local_1f0[7] = 0.0;
  local_1f0[0] = 1.0;
  local_1f0[4] = 1.0;
  local_1f0[8] = 1.0;
  lVar15 = 0;
  do {
    lVar18 = 0;
    do {
      if (lVar15 == lVar18) {
        local_1f0[lVar15 * 4] = (&local_108.x)[lVar15];
      }
      else {
        pdVar16[lVar18] = 0.0;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    lVar15 = lVar15 + 1;
    pdVar16 = pdVar16 + 3;
  } while (lVar15 != 3);
  dVar2 = A->x[1][1];
  dVar3 = A->x[1][2];
  dVar4 = A->x[2][1];
  dVar5 = A->x[2][0];
  dVar6 = A->x[1][0];
  dVar1 = A->x[2][2];
  if (ABS(A->x[0][2] * (dVar6 * dVar4 - dVar5 * dVar2) +
          A->x[0][0] * (dVar2 * dVar1 - dVar4 * dVar3) +
          A->x[0][1] * (dVar3 * dVar5 - dVar1 * dVar6)) -
      ABS(local_1f0[2] * (local_1f0[3] * local_1f0[7] - local_1f0[6] * local_1f0[4]) +
          local_1f0[0] * (local_1f0[4] * local_1f0[8] - local_1f0[7] * local_1f0[5]) +
          local_1f0[1] * (local_1f0[5] * local_1f0[6] - local_1f0[8] * local_1f0[3])) < dVar23) {
    local_1f0[0xf] = 0.0;
    local_1f0[0x10] = 0.0;
    local_1f0[0xd] = 0.0;
    local_1f0[0xe] = 0.0;
    local_1f0[0xb] = 0.0;
    local_1f0[0xc] = 0.0;
    local_1f0[9] = 0.0;
    local_1f0[10] = 0.0;
    local_1f0[0x11] = 0.0;
    lVar15 = 0;
    do {
      lVar18 = 0;
      pdVar16 = local_1f0;
      do {
        dVar1 = local_1f0[lVar15 * 3 + lVar18 + 9];
        lVar20 = 0;
        pdVar19 = pdVar16;
        do {
          dVar1 = dVar1 + (*(double (*) [3])*padVar17)[lVar20] * *pdVar19;
          lVar20 = lVar20 + 1;
          pdVar19 = pdVar19 + 3;
        } while (lVar20 != 3);
        local_1f0[lVar15 * 3 + lVar18 + 9] = dVar1;
        lVar18 = lVar18 + 1;
        pdVar16 = pdVar16 + 1;
      } while (lVar18 != 3);
      lVar15 = lVar15 + 1;
      padVar17 = padVar17 + 1;
    } while (lVar15 != 3);
    local_f0 = dVar22;
    local_e8 = dVar9;
    local_e0 = dVar12;
    local_d8 = dVar7;
    local_d0 = dVar10;
    local_c8 = dVar13;
    local_c0 = dVar8;
    local_b8 = dVar11;
    local_b0 = dVar14;
    local_158[0] = 0.0;
    local_158[1] = 0.0;
    local_158[2] = 0.0;
    local_158[3] = 0.0;
    local_158[4] = 0.0;
    local_158[5] = 0.0;
    local_158[6] = 0.0;
    local_158[7] = 0.0;
    local_158[8] = 0.0;
    pdVar16 = local_1f0 + 9;
    lVar15 = 0;
    do {
      lVar18 = 0;
      pdVar19 = &local_f0;
      do {
        dVar22 = local_158[lVar15 * 3 + lVar18];
        lVar20 = 0;
        pdVar21 = pdVar19;
        do {
          dVar22 = dVar22 + pdVar16[lVar20] * *pdVar21;
          lVar20 = lVar20 + 1;
          pdVar21 = pdVar21 + 3;
        } while (lVar20 != 3);
        local_158[lVar15 * 3 + lVar18] = dVar22;
        lVar18 = lVar18 + 1;
        pdVar19 = pdVar19 + 1;
      } while (lVar18 != 3);
      lVar15 = lVar15 + 1;
      pdVar16 = pdVar16 + 3;
    } while (lVar15 != 3);
    pdVar16 = local_158;
    lVar15 = 0;
    do {
      lVar18 = 0;
      do {
        if (dVar23 <= ABS((*(double (*) [3])*(double (*) [3])A)[lVar18] - pdVar16[lVar18])) {
          __assert_fail("abs(A[i][j]-MA[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x9d,
                        "void testJacobiEigenSolver(const TM &) [TM = Imath_2_5::Matrix33<double>]")
          ;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      lVar15 = lVar15 + 1;
      pdVar16 = pdVar16 + 3;
      A = (Matrix33<double> *)((long)A + 0x18);
    } while (lVar15 != 3);
    return;
  }
  __assert_fail("abs(A.determinant()) - abs(MS.determinant()) < threshold",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                ,0x96,"void testJacobiEigenSolver(const TM &) [TM = Imath_2_5::Matrix33<double>]");
}

Assistant:

void
testJacobiEigenSolver(const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold(A);

    TM AA(A);
    TV S;
    TM V;

    jacobiEigenSolver(AA, S, V);

    // Orthogonality of V
    verifyOrthonormal(V, threshold);
 
    // Determinant of V
    assert(abs(V.determinant()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (size_t i = 0; i < TM::dimensions(); ++i)
        for (size_t j = 0; j < TM::dimensions(); ++j)
            if(i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert(abs(A.determinant()) - abs(MS.determinant()) <
               threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed();

    for (size_t i = 0; i < TM::dimensions(); ++i) 
        for (size_t j =0; j < TM::dimensions(); ++j) 
            assert(abs(A[i][j]-MA[i][j]) < threshold);
}